

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.h
# Opt level: O0

void __thiscall
cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
          (cmGeneratorExpressionInterpreter *this)

{
  cmGeneratorExpressionInterpreter *this_local;
  
  std::__cxx11::string::~string((string *)&this->Language);
  std::__cxx11::string::~string((string *)&this->Config);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&this->CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&this->GeneratorExpression);
  return;
}

Assistant:

cmGeneratorExpressionInterpreter(cmLocalGenerator* localGenerator,
                                   std::string config,
                                   cmGeneratorTarget const* headTarget,
                                   std::string language = std::string())
    : LocalGenerator(localGenerator)
    , Config(std::move(config))
    , HeadTarget(headTarget)
    , Language(std::move(language))
  {
  }